

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::NonMaximumSuppression_PickTop::ByteSizeLong
          (NonMaximumSuppression_PickTop *this)

{
  ulong uVar1;
  size_t sVar2;
  
  sVar2 = (size_t)((uint)this->perclass_ * 2);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

inline bool NonMaximumSuppression_PickTop::_internal_perclass() const {
  return perclass_;
}